

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,long>
          (TryCast *this,string_t input,int64_t *result,bool strict)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  undefined4 uVar10;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  bool bVar17;
  ExponentData exponent;
  long local_90;
  byte local_88;
  IntegerDecimalCastData<long> local_78;
  long *local_60;
  ulong local_58;
  undefined4 local_4c;
  char *local_48;
  string_t input_local;
  
  local_60 = input.value._8_8_;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar12 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar12 = input_local.value.pointer.prefix;
  }
  uVar4 = (ulong)this & 0xffffffff;
  uVar15 = 0;
  while( true ) {
    uVar7 = uVar4 - uVar15;
    local_88 = (byte)result;
    input_local.value._0_8_ = this;
    if (uVar7 == 0) break;
    bVar2 = pcVar12[uVar15];
    if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
      if (bVar2 == 0x2d) {
        uVar8 = uVar4 - uVar15;
        local_90 = 0;
        uVar7 = 1;
        goto LAB_01264b4a;
      }
      if ((uVar4 - 1 == uVar15) || (bVar2 != 0x30)) {
        if ((local_88 & bVar2 == 0x2b) == 0) {
          uVar11 = (uint)(bVar2 == 0x2b);
LAB_01264d73:
          uVar14 = (ulong)uVar11;
          local_90 = 0;
          uVar8 = uVar14;
          goto LAB_01264d83;
        }
        break;
      }
      cVar1 = pcVar12[uVar15 + 1];
      if (cVar1 == 'B') {
LAB_01264e6d:
        uVar7 = ~uVar15 + uVar4;
        local_90 = 0;
        uVar14 = 1;
        goto LAB_01264e81;
      }
      if (cVar1 != 'x') {
        if (cVar1 == 'b') goto LAB_01264e6d;
        if (cVar1 != 'X') {
          if ((local_88 & (byte)(cVar1 - 0x30U) < 10) == 0) {
            uVar11 = 0;
            goto LAB_01264d73;
          }
          break;
        }
      }
      uVar14 = 1;
      uVar7 = ~uVar15 + uVar4;
      local_90 = 0;
      goto LAB_01264c53;
    }
    uVar15 = uVar15 + 1;
  }
LAB_01265033:
  uVar15 = 0;
  while( true ) {
    uVar7 = uVar4 - uVar15;
    if (uVar7 == 0) {
      return false;
    }
    bVar2 = pcVar12[uVar15];
    if ((0x20 < (ulong)bVar2) || ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
    uVar15 = uVar15 + 1;
  }
  local_78.result = 0;
  local_78.decimal = 0;
  local_78._16_8_ = 0;
  if (bVar2 == 0x2d) {
    local_78.result = 0;
    uVar8 = 1;
    while (uVar14 = uVar8, uVar14 < uVar7) {
      bVar2 = pcVar12[uVar15 + uVar14];
      bVar9 = bVar2 - 0x30;
      if (9 < bVar9) {
        if (bVar2 != 0x2e) goto LAB_01265498;
        if (local_88 != 0) {
          return false;
        }
        uVar8 = uVar14 + 1;
        local_78.decimal_digits = 0;
        uVar3 = uVar8;
        local_78.decimal = 0;
        goto LAB_01265361;
      }
      uVar8 = (0x8000000000000000 - (ulong)bVar9) / 10;
      if (SBORROW8(local_78.result,-uVar8) != (long)(local_78.result + uVar8) < 0) {
        return false;
      }
      local_78.result = local_78.result * 10 - (ulong)bVar9;
      uVar8 = uVar7;
      if ((~uVar14 + uVar4 != uVar15) &&
         (uVar8 = uVar14 + 1, pcVar12[uVar15 + 1 + uVar14] == '_' && local_88 == 0)) {
        if ((uVar4 - uVar14) - 2 == uVar15) {
          return false;
        }
        uVar8 = uVar14 + 2;
        if (9 < (byte)(pcVar12[uVar15 + 2 + uVar14] - 0x30U)) {
          return false;
        }
      }
    }
LAB_01265316:
    bVar17 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
                       (&local_78);
    if (!bVar17) {
      return false;
    }
    if (uVar14 < 2) {
      return false;
    }
    goto LAB_01265646;
  }
  if ((uVar4 - 1 == uVar15) || (bVar2 != 0x30)) {
    if ((local_88 & bVar2 == 0x2b) != 0) {
      return false;
    }
    uVar8 = (ulong)(bVar2 == 0x2b);
LAB_01265263:
    local_78.result = 0;
    uVar14 = uVar8;
    while (uVar3 = uVar14, uVar3 < uVar7) {
      bVar2 = pcVar12[uVar15 + uVar3];
      bVar9 = bVar2 - 0x30;
      if (9 < bVar9) {
        if (bVar2 != 0x2e) goto LAB_0126565d;
        if (local_88 != 0) {
          return false;
        }
        uVar14 = uVar3 + 1;
        local_78.decimal_digits = 0;
        uVar6 = uVar14;
        local_78.decimal = 0;
        goto LAB_01265537;
      }
      if ((long)(((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 10 + (ulong)bVar9;
      uVar14 = uVar7;
      if ((~uVar3 + uVar4 != uVar15) &&
         (uVar14 = uVar3 + 1, pcVar12[uVar15 + 1 + uVar3] == '_' && local_88 == 0)) {
        if ((uVar4 - uVar3) - 2 == uVar15) {
          return false;
        }
        uVar14 = uVar3 + 2;
        if (9 < (byte)(pcVar12[uVar15 + 2 + uVar3] - 0x30U)) {
          return false;
        }
      }
    }
LAB_012654ea:
    bVar17 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                       (&local_78);
    if (!bVar17) {
      return false;
    }
    if (uVar3 <= uVar8) {
      return false;
    }
    goto LAB_01265646;
  }
  cVar1 = pcVar12[uVar15 + 1];
  if (cVar1 == 'B') {
LAB_01265404:
    local_78.result = 0;
    uVar7 = 1;
    while (uVar7 < ~uVar15 + uVar4) {
      uVar8 = 0;
      if ((pcVar12[uVar15 + 1 + uVar7] != '0') && (uVar8 = 1, pcVar12[uVar15 + 1 + uVar7] != '1')) {
        return false;
      }
      uVar14 = ~uVar15 + uVar4;
      if ((uVar4 - uVar7) - 2 != uVar15) {
        if (pcVar12[uVar15 + 2 + uVar7] == '_') {
          if ((uVar4 - uVar7) - 3 == uVar15) {
            return false;
          }
          if ((pcVar12[uVar15 + 3 + uVar7] & 0xfeU) != 0x30) {
            return false;
          }
          uVar14 = uVar7 + 2;
        }
        else {
          uVar14 = uVar7 + 1;
        }
      }
      if (0x3fffffffffffffff < local_78.result) {
        return false;
      }
      local_78.result = uVar8 + local_78.result * 2;
      uVar7 = uVar14;
    }
    bVar17 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                       (&local_78);
  }
  else {
    if (cVar1 != 'x') {
      if (cVar1 == 'b') goto LAB_01265404;
      if (cVar1 != 'X') {
        if ((local_88 & (byte)(cVar1 - 0x30U) < 10) != 0) {
          return false;
        }
        uVar8 = 0;
        goto LAB_01265263;
      }
    }
    lVar13 = 0;
    uVar7 = 1;
    while (uVar7 < ~uVar15 + uVar4) {
      bVar2 = pcVar12[uVar15 + 1 + uVar7];
      bVar9 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar9 = bVar2;
      }
      bVar17 = StringUtil::CharacterIsHex(bVar9);
      if (!bVar17) {
        return false;
      }
      uVar10 = 0xd0;
      if ('`' < (char)bVar9) {
        uVar10 = 0xa9;
      }
      uVar8 = ~uVar15 + uVar4;
      if ((uVar4 - uVar7) - 2 != uVar15) {
        if (pcVar12[uVar15 + 2 + uVar7] == '_') {
          if ((uVar4 - uVar7) - 3 == uVar15) {
            return false;
          }
          local_58 = CONCAT44(local_58._4_4_,uVar10);
          bVar17 = StringUtil::CharacterIsHex(pcVar12[uVar15 + 3 + uVar7]);
          if (!bVar17) {
            return false;
          }
          uVar8 = uVar7 + 2;
          uVar10 = (undefined4)local_58;
        }
        else {
          uVar8 = uVar7 + 1;
        }
      }
      bVar9 = (char)uVar10 + bVar9;
      if ((long)((ulong)(bVar9 >> 4) ^ 0x7ffffffffffffff) < lVar13) {
        return false;
      }
      lVar13 = lVar13 * 0x10 + (ulong)bVar9;
      uVar7 = uVar8;
    }
    local_78.result = lVar13;
    bVar17 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                       (&local_78);
  }
  bVar17 = (bool)(1 < uVar7 & bVar17);
joined_r0x01265640:
  if (bVar17 == false) {
    return false;
  }
LAB_01265646:
  *local_60 = local_78.result;
  return true;
LAB_01264b4a:
  uVar14 = uVar7;
  if (uVar8 <= uVar14) goto joined_r0x0126501b;
  bVar2 = pcVar12[uVar15 + uVar14];
  bVar9 = bVar2 - 0x30;
  if (9 < bVar9) {
    if (bVar2 == 0x2e) {
      if (local_88 != 0) goto LAB_01265033;
      if (uVar8 <= uVar14 + 1) goto joined_r0x0126501b;
      if ((uVar14 < 2) ||
         (bVar2 = pcVar12[uVar15 + 1 + uVar14], uVar14 = uVar14 + 1, (byte)(bVar2 - 0x30) < 10))
      goto LAB_01265033;
    }
    if ((bVar2 < 0x21) && ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      uVar7 = uVar14 + 1;
      uVar14 = uVar7;
      if (uVar7 < uVar8) {
        uVar14 = uVar8;
      }
      goto LAB_01264f3a;
    }
    goto LAB_01265033;
  }
  uVar7 = (0x8000000000000000 - (ulong)bVar9) / 10;
  if ((SBORROW8(local_90,-uVar7) != (long)(local_90 + uVar7) < 0) ||
     (((local_90 = local_90 * 10 - (ulong)bVar9, uVar7 = uVar8, ~uVar14 + uVar4 != uVar15 &&
       (uVar7 = uVar14 + 1, pcVar12[uVar15 + 1 + uVar14] == '_' && local_88 == 0)) &&
      (((uVar4 - uVar14) - 2 == uVar15 ||
       (uVar7 = uVar14 + 2, 9 < (byte)(pcVar12[uVar15 + 2 + uVar14] - 0x30U)))))))
  goto LAB_01265033;
  goto LAB_01264b4a;
LAB_01264f3a:
  if (uVar8 <= uVar7) goto joined_r0x0126501b;
  if ((0x20 < (ulong)(byte)pcVar12[uVar15 + uVar7]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar12[uVar15 + uVar7] & 0x3f) & 1) == 0)) goto LAB_01265033;
  uVar7 = uVar7 + 1;
  goto LAB_01264f3a;
LAB_01264e81:
  if (uVar7 <= uVar14) goto joined_r0x0126501b;
  if (pcVar12[uVar15 + 1 + uVar14] == '0') {
    uVar8 = 0;
  }
  else {
    uVar8 = 1;
    if (pcVar12[uVar15 + 1 + uVar14] != '1') goto LAB_01265033;
  }
  uVar3 = uVar7;
  if ((uVar4 - uVar14) - 2 != uVar15) {
    if (pcVar12[uVar15 + 2 + uVar14] == '_') {
      if (((uVar4 - uVar14) - 3 == uVar15) || ((pcVar12[uVar15 + 3 + uVar14] & 0xfeU) != 0x30))
      goto LAB_01265033;
      uVar3 = uVar14 + 2;
    }
    else {
      uVar3 = uVar14 + 1;
    }
  }
  uVar14 = uVar3;
  if (0x3fffffffffffffff < local_90) goto LAB_01265033;
  local_90 = uVar8 + local_90 * 2;
  goto LAB_01264e81;
LAB_01264d83:
  uVar3 = uVar8;
  if (uVar7 <= uVar3) goto LAB_01264f73;
  bVar2 = pcVar12[uVar15 + uVar3];
  bVar9 = bVar2 - 0x30;
  if (9 < bVar9) {
    if (bVar2 == 0x2e) {
      if (local_88 != 0) goto LAB_01265033;
      uVar8 = uVar3 + 1;
      if (uVar7 <= uVar8) {
        bVar17 = uVar14 < uVar3;
        uVar3 = uVar8;
        if (bVar17) goto LAB_01264f73;
        goto LAB_01265033;
      }
      if ((uVar3 <= uVar14) ||
         (bVar2 = pcVar12[uVar15 + 1 + uVar3], uVar3 = uVar8, (byte)(bVar2 - 0x30) < 10))
      goto LAB_01265033;
    }
    if ((bVar2 < 0x21) && ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      uVar8 = uVar3 + 1;
      uVar3 = uVar8;
      if (uVar8 < uVar7) {
        uVar3 = uVar7;
      }
      goto LAB_01264ff4;
    }
    goto LAB_01265033;
  }
  if (((long)(((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10) < local_90) ||
     (((local_90 = local_90 * 10 + (ulong)bVar9, uVar8 = uVar7, ~uVar3 + uVar4 != uVar15 &&
       (uVar8 = uVar3 + 1, pcVar12[uVar15 + 1 + uVar3] == '_' && local_88 == 0)) &&
      (((uVar4 - uVar3) - 2 == uVar15 ||
       (uVar8 = uVar3 + 2, 9 < (byte)(pcVar12[uVar15 + 2 + uVar3] - 0x30U))))))) goto LAB_01265033;
  goto LAB_01264d83;
LAB_01264ff4:
  if (uVar7 <= uVar8) goto LAB_01264f73;
  if ((0x20 < (ulong)(byte)pcVar12[uVar15 + uVar8]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar12[uVar15 + uVar8] & 0x3f) & 1) == 0)) goto LAB_01265033;
  uVar8 = uVar8 + 1;
  goto LAB_01264ff4;
LAB_01264f73:
  if (uVar14 < uVar3) goto LAB_0126501d;
  goto LAB_01265033;
LAB_01264c53:
  if (uVar7 <= uVar14) goto joined_r0x0126501b;
  local_48 = pcVar12 + uVar14;
  bVar2 = local_48[uVar15 + 1];
  bVar9 = bVar2 | 0x20;
  if (0x19 < (byte)(bVar2 + 0xbf)) {
    bVar9 = bVar2;
  }
  local_58 = uVar14;
  bVar17 = StringUtil::CharacterIsHex(bVar9);
  if (!bVar17) goto LAB_01265033;
  uVar10 = 0xd0;
  if ('`' < (char)bVar9) {
    uVar10 = 0xa9;
  }
  uVar14 = uVar7;
  if ((uVar4 - local_58) - 2 != uVar15) {
    if (local_48[uVar15 + 2] == '_') {
      local_4c = uVar10;
      if (((uVar4 - local_58) - 3 == uVar15) ||
         (bVar17 = StringUtil::CharacterIsHex(local_48[uVar15 + 3]), !bVar17)) goto LAB_01265033;
      uVar14 = local_58 + 2;
      uVar10 = local_4c;
    }
    else {
      uVar14 = local_58 + 1;
    }
  }
  bVar9 = (char)uVar10 + bVar9;
  if ((long)((ulong)(bVar9 >> 4) ^ 0x7ffffffffffffff) < local_90) goto LAB_01265033;
  local_90 = local_90 * 0x10 + (ulong)bVar9;
  goto LAB_01264c53;
joined_r0x0126501b:
  if (1 < uVar14) {
LAB_0126501d:
    *local_60 = local_90;
    return true;
  }
  goto LAB_01265033;
LAB_01265361:
  uVar6 = uVar3;
  if (uVar6 < uVar7) {
    bVar2 = pcVar12[uVar15 + uVar6];
    bVar9 = bVar2 - 0x30;
    if (bVar9 < 10) goto code_r0x01265381;
    bVar17 = uVar14 < 2;
    local_78._18_6_ = 0;
    uVar14 = uVar6;
    if (uVar6 <= uVar8 && bVar17) {
      return false;
    }
LAB_01265498:
    if (bVar2 - 9 < 5) {
LAB_012654a7:
      uVar4 = uVar14 + 1;
      uVar14 = uVar4;
      if (uVar4 < uVar7) {
        uVar14 = uVar7;
      }
      for (; uVar4 < uVar7; uVar4 = uVar4 + 1) {
        if (0x20 < (ulong)(byte)pcVar12[uVar15 + uVar4]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar12[uVar15 + uVar4] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_01265316;
    }
    if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
      if (bVar2 != 0x20) {
        return false;
      }
      goto LAB_012654a7;
    }
    if (uVar14 == 1 || local_88 != 0) {
      return false;
    }
    if (uVar7 <= uVar14 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar12 = pcVar12 + uVar15 + uVar14 + 1;
    iVar16 = ~uVar15 + (uVar4 - uVar14);
    if (*pcVar12 == '-') {
      bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar12,iVar16,&exponent,false);
    }
    else {
      bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar12,iVar16,&exponent,false);
    }
    if (bVar17 == false) {
      return false;
    }
    bVar17 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<long>,true>
                       (&local_78,exponent.result);
    goto joined_r0x01265640;
  }
  bVar17 = uVar14 < 2;
  local_78._18_6_ = 0;
  uVar14 = uVar6;
  if (uVar6 <= uVar8 && bVar17) {
    return false;
  }
  goto LAB_01265316;
code_r0x01265381:
  uVar3 = ((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10;
  lVar13 = local_78.decimal * 10 + (ulong)bVar9;
  if ((long)uVar3 < local_78.decimal) {
    lVar13 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar3);
  uVar3 = uVar7;
  local_78.decimal = lVar13;
  if ((~uVar6 + uVar4 != uVar15) && (uVar3 = uVar6 + 1, pcVar12[uVar15 + 1 + uVar6] == '_')) {
    if ((uVar4 - uVar6) - 2 == uVar15) {
      return false;
    }
    uVar3 = uVar6 + 2;
    if (9 < (byte)(pcVar12[uVar15 + 2 + uVar6] - 0x30U)) {
      return false;
    }
  }
  goto LAB_01265361;
LAB_01265537:
  uVar5 = uVar6;
  if (uVar7 <= uVar5) {
    bVar17 = uVar3 <= uVar8;
    local_78._18_6_ = 0;
    uVar3 = uVar5;
    if (uVar5 <= uVar14 && bVar17) {
      return false;
    }
    goto LAB_012654ea;
  }
  bVar2 = pcVar12[uVar15 + uVar5];
  bVar9 = bVar2 - 0x30;
  if (9 < bVar9) {
    bVar17 = uVar3 <= uVar8;
    local_78._18_6_ = 0;
    uVar3 = uVar5;
    if (uVar5 <= uVar14 && bVar17) {
      return false;
    }
LAB_0126565d:
    if (bVar2 - 9 < 5) {
LAB_0126566c:
      uVar4 = uVar3 + 1;
      uVar3 = uVar4;
      if (uVar4 < uVar7) {
        uVar3 = uVar7;
      }
      for (; uVar4 < uVar7; uVar4 = uVar4 + 1) {
        if (0x20 < (ulong)(byte)pcVar12[uVar15 + uVar4]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar12[uVar15 + uVar4] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_012654ea;
    }
    if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
      if (bVar2 != 0x20) {
        return false;
      }
      goto LAB_0126566c;
    }
    if (uVar3 == uVar8 || local_88 != 0) {
      return false;
    }
    if (uVar7 <= uVar3 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar12 = pcVar12 + uVar15 + uVar3 + 1;
    iVar16 = ~uVar15 + (uVar4 - uVar3);
    if (*pcVar12 == '-') {
      bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar12,iVar16,&exponent,false);
    }
    else {
      bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar12,iVar16,&exponent,false);
    }
    if (bVar17 == false) {
      return false;
    }
    bVar17 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<long>,false>
                       (&local_78,exponent.result);
    goto joined_r0x01265640;
  }
  uVar6 = ((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10;
  lVar13 = local_78.decimal * 10 + (ulong)bVar9;
  if ((long)uVar6 < local_78.decimal) {
    lVar13 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar6);
  uVar6 = uVar7;
  local_78.decimal = lVar13;
  if ((~uVar5 + uVar4 != uVar15) && (uVar6 = uVar5 + 1, pcVar12[uVar15 + 1 + uVar5] == '_')) {
    if ((uVar4 - uVar5) - 2 == uVar15) {
      return false;
    }
    uVar6 = uVar5 + 2;
    if (9 < (byte)(pcVar12[uVar15 + 2 + uVar5] - 0x30U)) {
      return false;
    }
  }
  goto LAB_01265537;
}

Assistant:

bool TryCast::Operation(string_t input, int64_t &result, bool strict) {
	return TrySimpleIntegerCast<int64_t>(input.GetData(), input.GetSize(), result, strict);
}